

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  element_type *peVar7;
  ostream *poVar8;
  char *pcVar9;
  MatrixDynSize *in_RSI;
  long *in_RDI;
  ulong in_R8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_XMM0_Qa;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  Index offset;
  bool first;
  MatrixDynSize *in_stack_00000820;
  VectorDynSize *in_stack_00000828;
  VectorDynSize *in_stack_00000830;
  VectorDynSize *in_stack_00000838;
  double in_stack_00000840;
  ConstraintsGroup *in_stack_00000848;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffc68;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffc70;
  ostringstream *this_00;
  VectorDynSize *in_stack_fffffffffffffc88;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc90;
  MatrixDynSize *in_stack_fffffffffffffc98;
  string local_2a8 [32];
  string local_288 [48];
  ostringstream local_258 [496];
  reference local_68;
  _Self local_60;
  _Self local_58;
  long local_50;
  long local_48;
  byte local_39;
  ulong local_38;
  MatrixDynSize *local_20;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_18;
  byte local_1;
  
  local_38 = in_R8;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  lVar3 = iDynTree::MatrixDynSize::rows();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 == lVar4) {
    lVar3 = iDynTree::MatrixDynSize::cols();
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar3 == lVar4) goto LAB_003028bb;
  }
  uVar5 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize(local_38,uVar5);
LAB_003028bb:
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                  *)0x3028cc);
  if (sVar6 == 0) {
    iDynTree::MatrixDynSize::zero();
    local_1 = 1;
  }
  else {
    local_39 = 1;
    local_48 = 0;
    local_50 = *in_RDI + 0x28;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                  *)in_stack_fffffffffffffc68);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffc68);
    while( true ) {
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      local_68 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                              *)0x302969);
      toEigen(in_stack_fffffffffffffc88);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3029a4);
      peVar7 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3029ac);
      ConstraintsGroup::constraintsDimension(peVar7);
      Eigen::
      DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::segment<unsigned_int>
                ((DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffc98,(Index)in_stack_fffffffffffffc90,
                 (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3029e1);
      toEigen(in_stack_fffffffffffffc88);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffc70,
                 (DenseBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
                  *)in_stack_fffffffffffffc68);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x302a1e);
      in_stack_fffffffffffffc88 =
           (VectorDynSize *)
           std::
           __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x302a26);
      in_stack_fffffffffffffc90 = local_18;
      in_stack_fffffffffffffc98 = local_20;
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x302a65);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x302a81);
      bVar1 = ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl
                        (in_stack_00000848,in_stack_00000840,in_stack_00000838,in_stack_00000830,
                         in_stack_00000828,in_stack_00000820);
      if (!bVar1) {
        this_00 = local_258;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar8 = std::operator<<((ostream *)this_00,"Error while evaluating constraint ");
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x302aed);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x302af5);
        ConstraintsGroup::name_abi_cxx11_((ConstraintsGroup *)in_stack_fffffffffffffc68);
        poVar8 = std::operator<<(poVar8,local_288);
        std::operator<<(poVar8,".");
        std::__cxx11::string::~string(local_288);
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintSecondPartialDerivativeWRTStateControl",pcVar9
                  );
        std::__cxx11::string::~string(local_2a8);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_258);
        goto LAB_00302d0c;
      }
      if ((local_39 & 1) == 0) {
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x302c84);
        toEigen(in_stack_fffffffffffffc98);
        toEigen(in_stack_fffffffffffffc98);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator+=(in_stack_fffffffffffffc90,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)in_stack_fffffffffffffc88);
      }
      else {
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x302c28);
        toEigen(in_stack_fffffffffffffc98);
        toEigen(in_stack_fffffffffffffc98);
        Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::operator=
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        local_39 = 0;
      }
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x302cd0);
      peVar7 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x302cd8);
      uVar2 = ConstraintsGroup::constraintsDimension(peVar7);
      local_48 = (ulong)uVar2 + local_48;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                    *)in_stack_fffffffffffffc70);
    }
    local_1 = 1;
  }
LAB_00302d0c:
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if ((hessian.rows() != state.size()) || (hessian.cols() != control.size())) {
                hessian.resize(state.size(), control.size());
            }

            if (m_pimpl->constraintsGroups.size() == 0) {
                hessian.zero();
                return true;
            }

            bool first = true;
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                toEigen(group.second->lambdaBuffer) = toEigen(lambda).segment(offset, group.second->group_ptr->constraintsDimension());

                if (! group.second->group_ptr->constraintSecondPartialDerivativeWRTStateControl(time, state, control, group.second->lambdaBuffer, group.second->mixedHessianBuffer)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }
                if (first){
                    toEigen(hessian) = toEigen(group.second->mixedHessianBuffer);
                    first = false;
                } else {
                    toEigen(hessian) += toEigen(group.second->mixedHessianBuffer);
                }
                offset += group.second->group_ptr->constraintsDimension();
            }
            return true;
        }